

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

Result __thiscall tonk::gateway::SSDPRequester::InitializeSockets(SSDPRequester *this)

{
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_00;
  undefined8 __p;
  StateMachine *pSVar1;
  socklen_t in_ECX;
  Result *success;
  SSDPRequester *in_RSI;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *this_01;
  address *this_02;
  long lVar2;
  error_code ec;
  address bindAddr;
  data_union local_5c;
  address local_40;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
            ((tonk *)&bindAddr,
             (in_RSI->Host->Context)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
  __p = bindAddr._0_8_;
  bindAddr.type_ = ipv4;
  bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  this_00 = &in_RSI->Socket_UDP;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)this_00,(pointer)__p);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)&bindAddr);
  this_01 = &((in_RSI->Socket_UDP)._M_t.
              super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              .
              super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl)->
             super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
  if (this_01 == (basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0)
  {
    Result::OutOfMemory();
    return (Result)(ErrorResult *)this;
  }
  local_5c.v6.sin6_scope_id = 0;
  local_5c._8_2_ = 0;
  local_5c._10_2_ = 0;
  local_5c._12_4_ = 0;
  local_5c._16_2_ = 0;
  local_5c._18_2_ = 0;
  local_5c._20_4_ = 0;
  local_5c.base.sa_family = 2;
  local_5c._2_6_ = 0;
  if ((in_RSI->State->InterfaceAddress)._M_string_length == 0) {
    local_5c.base.sa_family = 2;
    local_5c._18_2_ = 0;
    local_5c._20_4_ = 0;
    local_5c.v6.sin6_scope_id = 0;
    local_5c._2_6_ = 0;
    local_5c._8_2_ = 0;
    local_5c._10_2_ = 0;
    local_5c._12_4_ = 0;
    local_5c._16_2_ = 0;
    bindAddr.type_ = 2;
  }
  else {
    asio::ip::make_address(&bindAddr,&in_RSI->State->InterfaceAddress,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))(&local_40);
      lVar2 = (long)ec._M_value;
      pSVar1 = (StateMachine *)operator_new(0x38);
      pSVar1->Host = (AsioHost *)"Provided InterfaceAddress was invalid";
      std::__cxx11::string::string((string *)&pSVar1->SSDP,(string *)&local_40);
      this_02 = &local_40;
      goto LAB_0015edcf;
    }
    asio::ip::detail::endpoint::endpoint((endpoint *)&local_5c.base,&bindAddr,0);
    this_01 = &((this_00->_M_t).
                super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                .
                super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl)->
               super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
    bindAddr.type_ = (uint)(local_5c.base.sa_family != 2) * 8 + 2;
  }
  asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::open
            (this_01,(char *)&bindAddr,(int)&ec);
  if (ec._M_value == 0) {
    bindAddr.type_ = ipv6;
    asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *)
               (this_00->_M_t).
               super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               .
               super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl,(boolean<1,_2> *)&bindAddr,&ec);
    if (ec._M_value == 0) {
      asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
                (&((this_00->_M_t).
                   super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   .
                   super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                  ._M_head_impl)->
                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,
                 (int)&local_5c,(sockaddr *)&ec,in_ECX);
      if (ec._M_value == 0) {
        PostNextRead_UDP(in_RSI);
        this->State = (StateMachine *)0x0;
        return (Result)(ErrorResult *)this;
      }
      (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
      lVar2 = (long)ec._M_value;
      pSVar1 = (StateMachine *)operator_new(0x38);
      pSVar1->Host = (AsioHost *)"UDP bind failed";
      std::__cxx11::string::string((string *)&pSVar1->SSDP,(string *)&bindAddr);
    }
    else {
      (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
      lVar2 = (long)ec._M_value;
      pSVar1 = (StateMachine *)operator_new(0x38);
      pSVar1->Host = (AsioHost *)"UDP socket set_option reuse_address failed";
      std::__cxx11::string::string((string *)&pSVar1->SSDP,(string *)&bindAddr);
    }
  }
  else {
    (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
    lVar2 = (long)ec._M_value;
    pSVar1 = (StateMachine *)operator_new(0x38);
    pSVar1->Host = (AsioHost *)"UDP socket open failed";
    std::__cxx11::string::string((string *)&pSVar1->SSDP,(string *)&bindAddr);
  }
  this_02 = &bindAddr;
LAB_0015edcf:
  *(undefined4 *)((long)&(pSVar1->API_Lock).super___mutex_base._M_mutex + 0x18) = 2;
  *(long *)((long)&(pSVar1->API_Lock).super___mutex_base._M_mutex + 0x20) = lVar2;
  this->State = pSVar1;
  std::__cxx11::string::~string((string *)this_02);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::InitializeSockets()
{
    asio::error_code ec;

    Socket_UDP = MakeUniqueNoThrow<asio::ip::udp::socket>(*Host->Context);
    if (!Socket_UDP) {
        return Result::OutOfMemory();
    }

    UDPAddress bindAddress;

    // If application specified an interface address:
    if (State->InterfaceAddress.empty()) {
        // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
        bindAddress = UDPAddress(asio::ip::udp::v4(), 0);
    }
    else
    {
        // Convert provided interface address to Asio address
        const asio::ip::address bindAddr = asio::ip::make_address(State->InterfaceAddress, ec);
        if (ec) {
            return Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
        }

        // Bind to the provided interface address
        bindAddress = UDPAddress(bindAddr, 0);
    }

    Socket_UDP->open(bindAddress.protocol(), ec);
    if (ec) {
        return Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->set_option(asio::socket_base::reuse_address(true), ec);
    if (ec) {
        return Result("UDP socket set_option reuse_address failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->bind(bindAddress, ec);
    if (ec) {
        return Result("UDP bind failed", ec.message(), ErrorType::Asio, ec.value());
    }

    // Start listening
    PostNextRead_UDP();

    return Result::Success();
}